

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O1

url * __thiscall m2d::savanna::endpoint::url(url *__return_storage_ptr__,endpoint *this)

{
  string local_30;
  
  (*this->_vptr_endpoint[8])(&local_30);
  savanna::url::url(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

savanna::url url()
		{
			return savanna::url(build_url_str());
		}